

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305_Simd128.c
# Opt level: O0

void Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize
               (Lib_IntVector_Intrinsics_vec128 *out,Lib_IntVector_Intrinsics_vec128 *p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  Lib_IntVector_Intrinsics_vec128 o4;
  Lib_IntVector_Intrinsics_vec128 o3;
  Lib_IntVector_Intrinsics_vec128 o2;
  Lib_IntVector_Intrinsics_vec128 o1;
  Lib_IntVector_Intrinsics_vec128 o00;
  Lib_IntVector_Intrinsics_vec128 c4;
  Lib_IntVector_Intrinsics_vec128 tmp4;
  Lib_IntVector_Intrinsics_vec128 l3;
  Lib_IntVector_Intrinsics_vec128 c3;
  Lib_IntVector_Intrinsics_vec128 tmp3;
  Lib_IntVector_Intrinsics_vec128 l2;
  Lib_IntVector_Intrinsics_vec128 c2;
  Lib_IntVector_Intrinsics_vec128 tmp2;
  Lib_IntVector_Intrinsics_vec128 l1;
  Lib_IntVector_Intrinsics_vec128 c1;
  Lib_IntVector_Intrinsics_vec128 tmp1;
  Lib_IntVector_Intrinsics_vec128 l0;
  Lib_IntVector_Intrinsics_vec128 c0;
  Lib_IntVector_Intrinsics_vec128 tmp0;
  Lib_IntVector_Intrinsics_vec128 l;
  Lib_IntVector_Intrinsics_vec128 o41;
  Lib_IntVector_Intrinsics_vec128 o31;
  Lib_IntVector_Intrinsics_vec128 o21;
  Lib_IntVector_Intrinsics_vec128 o11;
  Lib_IntVector_Intrinsics_vec128 o01;
  Lib_IntVector_Intrinsics_vec128 o40;
  Lib_IntVector_Intrinsics_vec128 o30;
  Lib_IntVector_Intrinsics_vec128 o20;
  Lib_IntVector_Intrinsics_vec128 o10;
  Lib_IntVector_Intrinsics_vec128 o0;
  Lib_IntVector_Intrinsics_vec128 x42;
  Lib_IntVector_Intrinsics_vec128 x32;
  Lib_IntVector_Intrinsics_vec128 z03;
  Lib_IntVector_Intrinsics_vec128 x12;
  Lib_IntVector_Intrinsics_vec128 x31;
  Lib_IntVector_Intrinsics_vec128 x02;
  Lib_IntVector_Intrinsics_vec128 x21;
  Lib_IntVector_Intrinsics_vec128 z13;
  Lib_IntVector_Intrinsics_vec128 z02;
  Lib_IntVector_Intrinsics_vec128 x01;
  Lib_IntVector_Intrinsics_vec128 x2;
  Lib_IntVector_Intrinsics_vec128 x41;
  Lib_IntVector_Intrinsics_vec128 x11;
  Lib_IntVector_Intrinsics_vec128 z12;
  Lib_IntVector_Intrinsics_vec128 t;
  Lib_IntVector_Intrinsics_vec128 z11;
  Lib_IntVector_Intrinsics_vec128 z01;
  Lib_IntVector_Intrinsics_vec128 x4;
  Lib_IntVector_Intrinsics_vec128 x1;
  Lib_IntVector_Intrinsics_vec128 x3;
  Lib_IntVector_Intrinsics_vec128 x0;
  Lib_IntVector_Intrinsics_vec128 z1;
  Lib_IntVector_Intrinsics_vec128 z0;
  Lib_IntVector_Intrinsics_vec128 mask26;
  Lib_IntVector_Intrinsics_vec128 t4;
  Lib_IntVector_Intrinsics_vec128 t3;
  Lib_IntVector_Intrinsics_vec128 t2;
  Lib_IntVector_Intrinsics_vec128 t1;
  Lib_IntVector_Intrinsics_vec128 t0;
  Lib_IntVector_Intrinsics_vec128 a45;
  Lib_IntVector_Intrinsics_vec128 a35;
  Lib_IntVector_Intrinsics_vec128 a25;
  Lib_IntVector_Intrinsics_vec128 a15;
  Lib_IntVector_Intrinsics_vec128 a05;
  Lib_IntVector_Intrinsics_vec128 a44;
  Lib_IntVector_Intrinsics_vec128 a34;
  Lib_IntVector_Intrinsics_vec128 a24;
  Lib_IntVector_Intrinsics_vec128 a14;
  Lib_IntVector_Intrinsics_vec128 a04;
  Lib_IntVector_Intrinsics_vec128 a43;
  Lib_IntVector_Intrinsics_vec128 a33;
  Lib_IntVector_Intrinsics_vec128 a23;
  Lib_IntVector_Intrinsics_vec128 a13;
  Lib_IntVector_Intrinsics_vec128 a03;
  Lib_IntVector_Intrinsics_vec128 a42;
  Lib_IntVector_Intrinsics_vec128 a32;
  Lib_IntVector_Intrinsics_vec128 a22;
  Lib_IntVector_Intrinsics_vec128 a12;
  Lib_IntVector_Intrinsics_vec128 a02;
  Lib_IntVector_Intrinsics_vec128 a41;
  Lib_IntVector_Intrinsics_vec128 a31;
  Lib_IntVector_Intrinsics_vec128 a21;
  Lib_IntVector_Intrinsics_vec128 a11;
  Lib_IntVector_Intrinsics_vec128 a01;
  Lib_IntVector_Intrinsics_vec128 r254;
  Lib_IntVector_Intrinsics_vec128 r253;
  Lib_IntVector_Intrinsics_vec128 r252;
  Lib_IntVector_Intrinsics_vec128 r251;
  Lib_IntVector_Intrinsics_vec128 r241;
  Lib_IntVector_Intrinsics_vec128 r231;
  Lib_IntVector_Intrinsics_vec128 r221;
  Lib_IntVector_Intrinsics_vec128 r211;
  Lib_IntVector_Intrinsics_vec128 r201;
  Lib_IntVector_Intrinsics_vec128 r24;
  Lib_IntVector_Intrinsics_vec128 r23;
  Lib_IntVector_Intrinsics_vec128 r22;
  Lib_IntVector_Intrinsics_vec128 r21;
  Lib_IntVector_Intrinsics_vec128 r20;
  Lib_IntVector_Intrinsics_vec128 r14;
  Lib_IntVector_Intrinsics_vec128 r13;
  Lib_IntVector_Intrinsics_vec128 r12;
  Lib_IntVector_Intrinsics_vec128 r11;
  Lib_IntVector_Intrinsics_vec128 r10;
  Lib_IntVector_Intrinsics_vec128 a4;
  Lib_IntVector_Intrinsics_vec128 a3;
  Lib_IntVector_Intrinsics_vec128 a2;
  Lib_IntVector_Intrinsics_vec128 a1;
  Lib_IntVector_Intrinsics_vec128 a0;
  Lib_IntVector_Intrinsics_vec128 *r2;
  Lib_IntVector_Intrinsics_vec128 *r;
  Lib_IntVector_Intrinsics_vec128 *p_local;
  Lib_IntVector_Intrinsics_vec128 *out_local;
  long local_8d8;
  
  uVar24 = (*out)[0];
  uVar16 = (*out)[1];
  uVar14 = out[1][0];
  uVar17 = out[1][1];
  uVar15 = out[2][0];
  uVar25 = out[2][1];
  uVar18 = out[3][0];
  uVar29 = out[3][1];
  uVar27 = out[4][0];
  uVar28 = out[4][1];
  uVar30 = (*p)[0];
  uVar31 = p[1][0];
  uVar1 = p[2][0];
  uVar2 = p[3][0];
  uVar3 = p[10][0];
  uVar4 = p[0xb][0];
  uVar5 = p[0xc][0];
  uVar13 = p[0xd][0];
  uVar8 = (uVar5 & 0xffffffff) * 5;
  uVar19 = (uVar1 & 0xffffffff) * 5;
  uVar9 = (uVar13 & 0xffffffff) * 5;
  uVar20 = (uVar2 & 0xffffffff) * 5;
  uVar10 = (p[0xe][0] & 0xffffffffU) * 5;
  uVar21 = (p[4][0] & 0xffffffffU) * 5;
  uVar11 = (uVar3 & 0xffffffff) * (uVar24 & 0xffffffff) +
           (uVar10 & 0xffffffff) * (uVar14 & 0xffffffff) +
           (uVar9 & 0xffffffff) * (uVar15 & 0xffffffff) +
           (uVar8 & 0xffffffff) * (uVar18 & 0xffffffff) +
           ((uVar4 & 0xffffffff) * 5 & 0xffffffff) * (uVar27 & 0xffffffff);
  uVar22 = (uVar30 & 0xffffffff) * (uVar16 & 0xffffffff) +
           (uVar21 & 0xffffffff) * (uVar17 & 0xffffffff) +
           (uVar20 & 0xffffffff) * (uVar25 & 0xffffffff) +
           (uVar19 & 0xffffffff) * (uVar29 & 0xffffffff) +
           ((uVar31 & 0xffffffff) * 5 & 0xffffffff) * (uVar28 & 0xffffffff);
  uVar12 = (uVar13 & 0xffffffff) * (uVar24 & 0xffffffff) +
           (uVar5 & 0xffffffff) * (uVar14 & 0xffffffff) +
           (uVar4 & 0xffffffff) * (uVar15 & 0xffffffff) +
           (uVar3 & 0xffffffff) * (uVar18 & 0xffffffff) +
           (uVar10 & 0xffffffff) * (uVar27 & 0xffffffff);
  uVar23 = (uVar2 & 0xffffffff) * (uVar16 & 0xffffffff) +
           (uVar1 & 0xffffffff) * (uVar17 & 0xffffffff) +
           (uVar31 & 0xffffffff) * (uVar25 & 0xffffffff) +
           (uVar30 & 0xffffffff) * (uVar29 & 0xffffffff) +
           (uVar21 & 0xffffffff) * (uVar28 & 0xffffffff);
  uVar8 = (uVar4 & 0xffffffff) * (uVar24 & 0xffffffff) +
          (uVar3 & 0xffffffff) * (uVar14 & 0xffffffff) +
          (uVar10 & 0xffffffff) * (uVar15 & 0xffffffff) +
          (uVar9 & 0xffffffff) * (uVar18 & 0xffffffff) +
          (uVar8 & 0xffffffff) * (uVar27 & 0xffffffff) + (uVar11 >> 0x1a);
  uVar19 = (uVar31 & 0xffffffff) * (uVar16 & 0xffffffff) +
           (uVar30 & 0xffffffff) * (uVar17 & 0xffffffff) +
           (uVar21 & 0xffffffff) * (uVar25 & 0xffffffff) +
           (uVar20 & 0xffffffff) * (uVar29 & 0xffffffff) +
           (uVar19 & 0xffffffff) * (uVar28 & 0xffffffff) + (uVar22 >> 0x1a);
  uVar13 = (p[0xe][0] & 0xffffffffU) * (uVar24 & 0xffffffff) +
           (uVar13 & 0xffffffff) * (uVar14 & 0xffffffff) +
           (uVar5 & 0xffffffff) * (uVar15 & 0xffffffff) +
           (uVar4 & 0xffffffff) * (uVar18 & 0xffffffff) +
           (uVar3 & 0xffffffff) * (uVar27 & 0xffffffff) + (uVar12 >> 0x1a);
  uVar14 = (uVar5 & 0xffffffff) * (uVar24 & 0xffffffff) +
           (uVar4 & 0xffffffff) * (uVar14 & 0xffffffff) +
           (uVar3 & 0xffffffff) * (uVar15 & 0xffffffff) +
           (uVar10 & 0xffffffff) * (uVar18 & 0xffffffff) +
           (uVar9 & 0xffffffff) * (uVar27 & 0xffffffff) + (uVar8 >> 0x1a);
  uVar24 = (uVar1 & 0xffffffff) * (uVar16 & 0xffffffff) +
           (uVar31 & 0xffffffff) * (uVar17 & 0xffffffff) +
           (uVar30 & 0xffffffff) * (uVar25 & 0xffffffff) +
           (uVar21 & 0xffffffff) * (uVar29 & 0xffffffff) +
           (uVar20 & 0xffffffff) * (uVar28 & 0xffffffff) + (uVar19 >> 0x1a);
  uVar15 = (uVar11 & 0x3ffffff) + (uVar13 >> 0x1a) * 5;
  uVar25 = (uVar22 & 0x3ffffff) +
           ((p[4][0] & 0xffffffffU) * (uVar16 & 0xffffffff) +
            (uVar2 & 0xffffffff) * (uVar17 & 0xffffffff) +
            (uVar1 & 0xffffffff) * (uVar25 & 0xffffffff) +
            (uVar31 & 0xffffffff) * (uVar29 & 0xffffffff) +
            (uVar30 & 0xffffffff) * (uVar28 & 0xffffffff) + (uVar23 >> 0x1a) >> 0x1a) * 2;
  uVar18 = uVar24 & 0x3ffffff;
  uVar16 = (uVar12 & 0x3ffffff) + (uVar14 >> 0x1a);
  lVar26 = (uVar19 & 0x3ffffff) + (uVar25 >> 0x1a);
  uVar29 = (uVar23 & 0x3ffffff) + (uVar24 >> 0x1a) & 0x3ffffff;
  uVar17 = (uVar15 & 0x3ffffff) + local_8d8;
  uVar24 = (uVar25 & 0x3ffffff) * 2;
  uVar15 = (uVar8 & 0x3ffffff) + (uVar15 >> 0x1a) + lVar26 + (uVar17 >> 0x1a);
  uVar27 = lVar26 * 2 + (uVar24 >> 0x1a);
  uVar14 = (uVar14 & 0x3ffffff) + uVar18 + (uVar15 >> 0x1a);
  uVar28 = uVar18 * 2 + (uVar27 >> 0x1a);
  uVar25 = (uVar16 & 0x3ffffff) + uVar29 + (uVar14 >> 0x1a);
  uVar29 = uVar29 * 2 + (uVar28 >> 0x1a);
  uVar16 = (uVar13 & 0x3ffffff) + (uVar16 >> 0x1a) + (ulong)(uint)o40[0] + (uVar25 >> 0x1a);
  uVar30 = (ulong)(uint)o40[0] + (ulong)(uint)o40[0] + (uVar29 >> 0x1a);
  uVar18 = uVar16 >> 0x1a;
  uVar31 = uVar30 >> 0x1a;
  auVar7._8_8_ = uVar31;
  auVar7._0_8_ = uVar18;
  auVar6._8_8_ = 5;
  auVar6._0_8_ = 5;
  pblendw(auVar7,ZEXT816(0),0xcc);
  pblendw(auVar6,ZEXT816(0),0xcc);
  (*out)[0] = (uVar17 & 0x3ffffff) + uVar18 * 5;
  (*out)[1] = (uVar24 & 0x3ffffff) + uVar31 * 5;
  out[1][0] = uVar15 & 0x3ffffff;
  out[1][1] = uVar27 & 0x3ffffff;
  out[2][0] = uVar14 & 0x3ffffff;
  out[2][1] = uVar28 & 0x3ffffff;
  out[3][0] = uVar25 & 0x3ffffff;
  out[3][1] = uVar29 & 0x3ffffff;
  out[4][0] = uVar16 & 0x3ffffff;
  out[4][1] = uVar30 & 0x3ffffff;
  return;
}

Assistant:

void
Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(
  Lib_IntVector_Intrinsics_vec128 *out,
  Lib_IntVector_Intrinsics_vec128 *p
)
{
  Lib_IntVector_Intrinsics_vec128 *r = p;
  Lib_IntVector_Intrinsics_vec128 *r2 = p + 10U;
  Lib_IntVector_Intrinsics_vec128 a0 = out[0U];
  Lib_IntVector_Intrinsics_vec128 a1 = out[1U];
  Lib_IntVector_Intrinsics_vec128 a2 = out[2U];
  Lib_IntVector_Intrinsics_vec128 a3 = out[3U];
  Lib_IntVector_Intrinsics_vec128 a4 = out[4U];
  Lib_IntVector_Intrinsics_vec128 r10 = r[0U];
  Lib_IntVector_Intrinsics_vec128 r11 = r[1U];
  Lib_IntVector_Intrinsics_vec128 r12 = r[2U];
  Lib_IntVector_Intrinsics_vec128 r13 = r[3U];
  Lib_IntVector_Intrinsics_vec128 r14 = r[4U];
  Lib_IntVector_Intrinsics_vec128 r20 = r2[0U];
  Lib_IntVector_Intrinsics_vec128 r21 = r2[1U];
  Lib_IntVector_Intrinsics_vec128 r22 = r2[2U];
  Lib_IntVector_Intrinsics_vec128 r23 = r2[3U];
  Lib_IntVector_Intrinsics_vec128 r24 = r2[4U];
  Lib_IntVector_Intrinsics_vec128
  r201 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r20, r10);
  Lib_IntVector_Intrinsics_vec128
  r211 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r21, r11);
  Lib_IntVector_Intrinsics_vec128
  r221 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r22, r12);
  Lib_IntVector_Intrinsics_vec128
  r231 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r23, r13);
  Lib_IntVector_Intrinsics_vec128
  r241 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r24, r14);
  Lib_IntVector_Intrinsics_vec128 r251 = Lib_IntVector_Intrinsics_vec128_smul64(r211, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r252 = Lib_IntVector_Intrinsics_vec128_smul64(r221, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r253 = Lib_IntVector_Intrinsics_vec128_smul64(r231, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r254 = Lib_IntVector_Intrinsics_vec128_smul64(r241, 5ULL);
  Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_mul64(r201, a0);
  Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_mul64(r211, a0);
  Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_mul64(r221, a0);
  Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_mul64(r231, a0);
  Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_mul64(r241, a0);
  Lib_IntVector_Intrinsics_vec128
  a02 =
    Lib_IntVector_Intrinsics_vec128_add64(a01,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a1));
  Lib_IntVector_Intrinsics_vec128
  a12 =
    Lib_IntVector_Intrinsics_vec128_add64(a11,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a1));
  Lib_IntVector_Intrinsics_vec128
  a22 =
    Lib_IntVector_Intrinsics_vec128_add64(a21,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a1));
  Lib_IntVector_Intrinsics_vec128
  a32 =
    Lib_IntVector_Intrinsics_vec128_add64(a31,
      Lib_IntVector_Intrinsics_vec128_mul64(r221, a1));
  Lib_IntVector_Intrinsics_vec128
  a42 =
    Lib_IntVector_Intrinsics_vec128_add64(a41,
      Lib_IntVector_Intrinsics_vec128_mul64(r231, a1));
  Lib_IntVector_Intrinsics_vec128
  a03 =
    Lib_IntVector_Intrinsics_vec128_add64(a02,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a2));
  Lib_IntVector_Intrinsics_vec128
  a13 =
    Lib_IntVector_Intrinsics_vec128_add64(a12,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a2));
  Lib_IntVector_Intrinsics_vec128
  a23 =
    Lib_IntVector_Intrinsics_vec128_add64(a22,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a2));
  Lib_IntVector_Intrinsics_vec128
  a33 =
    Lib_IntVector_Intrinsics_vec128_add64(a32,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a2));
  Lib_IntVector_Intrinsics_vec128
  a43 =
    Lib_IntVector_Intrinsics_vec128_add64(a42,
      Lib_IntVector_Intrinsics_vec128_mul64(r221, a2));
  Lib_IntVector_Intrinsics_vec128
  a04 =
    Lib_IntVector_Intrinsics_vec128_add64(a03,
      Lib_IntVector_Intrinsics_vec128_mul64(r252, a3));
  Lib_IntVector_Intrinsics_vec128
  a14 =
    Lib_IntVector_Intrinsics_vec128_add64(a13,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a3));
  Lib_IntVector_Intrinsics_vec128
  a24 =
    Lib_IntVector_Intrinsics_vec128_add64(a23,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a3));
  Lib_IntVector_Intrinsics_vec128
  a34 =
    Lib_IntVector_Intrinsics_vec128_add64(a33,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a3));
  Lib_IntVector_Intrinsics_vec128
  a44 =
    Lib_IntVector_Intrinsics_vec128_add64(a43,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a3));
  Lib_IntVector_Intrinsics_vec128
  a05 =
    Lib_IntVector_Intrinsics_vec128_add64(a04,
      Lib_IntVector_Intrinsics_vec128_mul64(r251, a4));
  Lib_IntVector_Intrinsics_vec128
  a15 =
    Lib_IntVector_Intrinsics_vec128_add64(a14,
      Lib_IntVector_Intrinsics_vec128_mul64(r252, a4));
  Lib_IntVector_Intrinsics_vec128
  a25 =
    Lib_IntVector_Intrinsics_vec128_add64(a24,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a4));
  Lib_IntVector_Intrinsics_vec128
  a35 =
    Lib_IntVector_Intrinsics_vec128_add64(a34,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a4));
  Lib_IntVector_Intrinsics_vec128
  a45 =
    Lib_IntVector_Intrinsics_vec128_add64(a44,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a4));
  Lib_IntVector_Intrinsics_vec128 t0 = a05;
  Lib_IntVector_Intrinsics_vec128 t1 = a15;
  Lib_IntVector_Intrinsics_vec128 t2 = a25;
  Lib_IntVector_Intrinsics_vec128 t3 = a35;
  Lib_IntVector_Intrinsics_vec128 t4 = a45;
  Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
  Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t0, 26U);
  Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
  Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t0, mask26);
  Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
  Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
  Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
  Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
  Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
  Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
  Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
  Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
  Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
  Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
  Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
  Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
  Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
  Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
  Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
  Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
  Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
  Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
  Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
  Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
  Lib_IntVector_Intrinsics_vec128 o0 = x02;
  Lib_IntVector_Intrinsics_vec128 o10 = x12;
  Lib_IntVector_Intrinsics_vec128 o20 = x21;
  Lib_IntVector_Intrinsics_vec128 o30 = x32;
  Lib_IntVector_Intrinsics_vec128 o40 = x42;
  Lib_IntVector_Intrinsics_vec128
  o01 =
    Lib_IntVector_Intrinsics_vec128_add64(o0,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o0, o0));
  Lib_IntVector_Intrinsics_vec128
  o11 =
    Lib_IntVector_Intrinsics_vec128_add64(o10,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o10, o10));
  Lib_IntVector_Intrinsics_vec128
  o21 =
    Lib_IntVector_Intrinsics_vec128_add64(o20,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o20, o20));
  Lib_IntVector_Intrinsics_vec128
  o31 =
    Lib_IntVector_Intrinsics_vec128_add64(o30,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o30, o30));
  Lib_IntVector_Intrinsics_vec128
  o41 =
    Lib_IntVector_Intrinsics_vec128_add64(o40,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o40, o40));
  Lib_IntVector_Intrinsics_vec128
  l = Lib_IntVector_Intrinsics_vec128_add64(o01, Lib_IntVector_Intrinsics_vec128_zero);
  Lib_IntVector_Intrinsics_vec128
  tmp0 =
    Lib_IntVector_Intrinsics_vec128_and(l,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c0 = Lib_IntVector_Intrinsics_vec128_shift_right64(l, 26U);
  Lib_IntVector_Intrinsics_vec128 l0 = Lib_IntVector_Intrinsics_vec128_add64(o11, c0);
  Lib_IntVector_Intrinsics_vec128
  tmp1 =
    Lib_IntVector_Intrinsics_vec128_and(l0,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c1 = Lib_IntVector_Intrinsics_vec128_shift_right64(l0, 26U);
  Lib_IntVector_Intrinsics_vec128 l1 = Lib_IntVector_Intrinsics_vec128_add64(o21, c1);
  Lib_IntVector_Intrinsics_vec128
  tmp2 =
    Lib_IntVector_Intrinsics_vec128_and(l1,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c2 = Lib_IntVector_Intrinsics_vec128_shift_right64(l1, 26U);
  Lib_IntVector_Intrinsics_vec128 l2 = Lib_IntVector_Intrinsics_vec128_add64(o31, c2);
  Lib_IntVector_Intrinsics_vec128
  tmp3 =
    Lib_IntVector_Intrinsics_vec128_and(l2,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c3 = Lib_IntVector_Intrinsics_vec128_shift_right64(l2, 26U);
  Lib_IntVector_Intrinsics_vec128 l3 = Lib_IntVector_Intrinsics_vec128_add64(o41, c3);
  Lib_IntVector_Intrinsics_vec128
  tmp4 =
    Lib_IntVector_Intrinsics_vec128_and(l3,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c4 = Lib_IntVector_Intrinsics_vec128_shift_right64(l3, 26U);
  Lib_IntVector_Intrinsics_vec128
  o00 =
    Lib_IntVector_Intrinsics_vec128_add64(tmp0,
      Lib_IntVector_Intrinsics_vec128_smul64(c4, 5ULL));
  Lib_IntVector_Intrinsics_vec128 o1 = tmp1;
  Lib_IntVector_Intrinsics_vec128 o2 = tmp2;
  Lib_IntVector_Intrinsics_vec128 o3 = tmp3;
  Lib_IntVector_Intrinsics_vec128 o4 = tmp4;
  out[0U] = o00;
  out[1U] = o1;
  out[2U] = o2;
  out[3U] = o3;
  out[4U] = o4;
}